

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O1

lzma_filter_decoder * decoder_find(lzma_vli id)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(lzma_vli *)((long)&decoders[0].id + lVar1) == id) {
      return (lzma_filter_decoder *)((long)&decoders[0].id + lVar1);
    }
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x120);
  return (lzma_filter_decoder *)0x0;
}

Assistant:

static const lzma_filter_decoder *
decoder_find(lzma_vli id)
{
	size_t i;
	for (i = 0; i < ARRAY_SIZE(decoders); ++i)
		if (decoders[i].id == id)
			return decoders + i;

	return NULL;
}